

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O1

TPZVec<long_double> * __thiscall
TPZVec<long_double>::operator=(TPZVec<long_double> *this,TPZVec<long_double> *copy)

{
  longdouble *plVar1;
  longdouble *plVar2;
  long lVar3;
  long lVar4;
  
  if (this != copy) {
    (*this->_vptr_TPZVec[3])(this);
    lVar3 = copy->fNElements;
    if (0 < lVar3) {
      plVar1 = copy->fStore;
      plVar2 = this->fStore;
      lVar4 = 0;
      do {
        *(unkbyte10 *)((long)plVar2 + lVar4) = *(unkbyte10 *)((long)plVar1 + lVar4);
        lVar4 = lVar4 + 0x10;
        lVar3 = lVar3 + -1;
      } while (lVar3 != 0);
    }
  }
  return this;
}

Assistant:

TPZVec<T> &TPZVec<T>::operator=(const TPZVec<T> &copy){
    if (this != &copy) {

      Resize(copy.NElements());

      for (int64_t i = 0; i < copy.fNElements; i++)
          fStore[i] = copy.fStore[i];
    }
    return *this;
}